

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

bool __thiscall HEkkDual::reachedExactObjectiveBound(HEkkDual *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  value_type vVar5;
  double *pdVar6;
  reference pvVar7;
  HVectorBase<double> *this_00;
  undefined8 uVar8;
  long in_RDI;
  double dVar9;
  HighsInt i_1;
  HighsInt i;
  string action;
  double exact_value_residual;
  double exact_dual_objective_value;
  HVector dual_row;
  HVector dual_col;
  double perturbed_value_residual;
  double perturbed_dual_objective_value;
  double objective_bound;
  bool check_exact_dual_objective_value;
  HighsInt check_frequency;
  double use_row_ap_density;
  bool reached_exact_objective_bound;
  HVectorBase<double> *in_stack_fffffffffffffdd0;
  int local_1f0;
  int local_1ec;
  string local_1e8 [32];
  char *local_1c8;
  double local_1b0;
  vector<double,_std::allocator<double>_> vStack_188;
  undefined1 in_stack_fffffffffffffe97;
  HighsInt in_stack_fffffffffffffe98;
  SimplexAlgorithm in_stack_fffffffffffffe9c;
  HEkk *in_stack_fffffffffffffea0;
  HVector *in_stack_fffffffffffffed8;
  HVector *in_stack_fffffffffffffee0;
  HEkkDual *in_stack_fffffffffffffee8;
  vector<double,_std::allocator<double>_> avStack_d8 [2];
  HighsInt *in_stack_ffffffffffffff68;
  HEkkDual *in_stack_ffffffffffffff70;
  double local_28;
  double local_20;
  HighsLogOptions *local_18;
  byte local_9;
  
  local_9 = 0;
  local_20 = 0.01;
  pdVar6 = std::max<double>((double *)(*(long *)(in_RDI + 0x10) + 0x2850),&local_20);
  local_28 = 1.0;
  pdVar6 = std::min<double>(pdVar6,&local_28);
  local_18 = (HighsLogOptions *)*pdVar6;
  dVar9 = 1.0 / (double)local_18;
  if (*(int *)(*(long *)(in_RDI + 0x10) + 0x2944) % (int)dVar9 == 0) {
    dVar1 = *(double *)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + 0x140);
    dVar2 = *(double *)(*(long *)(in_RDI + 0x10) + 0x2958);
    HVectorBase<double>::HVectorBase(in_stack_fffffffffffffdd0);
    HVectorBase<double>::HVectorBase(in_stack_fffffffffffffdd0);
    local_1b0 = computeExactDualObjectiveValue
                          (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                           in_stack_fffffffffffffed8);
    local_1c8 = (char *)(local_1b0 - dVar1);
    std::__cxx11::string::string(local_1e8);
    if (local_1b0 <= dVar1) {
      std::__cxx11::string::operator=(local_1e8,"No   DualUB bailout");
    }
    else {
      highsLogDev(*(HighsLogOptions **)(*(long *)(in_RDI + 0x10) + 0x2958),(HighsLogType)dVar1,
                  (char *)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + 0x380),2,
                  "HEkkDual::solvePhase2: %12g = Objective > ObjectiveUB = %12g\n");
      std::__cxx11::string::operator=(local_1e8,"Have DualUB bailout");
      if (((*(byte *)(*(long *)(in_RDI + 0x10) + 0x28d5) & 1) != 0) ||
         ((*(byte *)(*(long *)(in_RDI + 0x10) + 0x28d4) & 1) != 0)) {
        HEkk::initialiseCost
                  (in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98,
                   (bool)in_stack_fffffffffffffe97);
      }
      for (local_1ec = 0; local_1ec < *(int *)(in_RDI + 0x1c); local_1ec = local_1ec + 1) {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            (*(long *)(in_RDI + 0x10) + 0x2560),(long)local_1ec);
        dVar3 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&vStack_188,(long)local_1ec);
        dVar4 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            (*(long *)(in_RDI + 0x10) + 0x2578),(long)local_1ec);
        *pvVar7 = dVar3 - dVar4;
      }
      for (local_1f0 = *(int *)(in_RDI + 0x1c); local_1f0 < *(int *)(in_RDI + 0x20);
          local_1f0 = local_1f0 + 1) {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (avStack_d8,(long)(local_1f0 - *(int *)(in_RDI + 0x1c)));
        vVar5 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            (*(long *)(in_RDI + 0x10) + 0x2578),(long)local_1f0);
        *pvVar7 = -vVar5;
      }
      *(undefined1 *)(in_RDI + 0xe0) = 0;
      correctDualInfeasibilities(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      local_9 = 1;
      *(undefined4 *)(*(long *)(in_RDI + 0x10) + 0x2970) = 0xb;
    }
    this_00 = (HVectorBase<double> *)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + 0x380);
    uVar8 = std::__cxx11::string::c_str();
    highsLogDev(local_18,(HighsLogType)(dVar2 - dVar1),local_1c8,this_00,1,
                "%s on iteration %d: Density %11.4g; Frequency %d: Residual(Perturbed = %g; Exact = %g)\n"
                ,uVar8,(ulong)*(uint *)(*(long *)(in_RDI + 0x10) + 0x36f8),(ulong)(uint)(int)dVar9);
    std::__cxx11::string::~string(local_1e8);
    HVectorBase<double>::~HVectorBase(this_00);
    HVectorBase<double>::~HVectorBase(this_00);
  }
  return (bool)(local_9 & 1);
}

Assistant:

bool HEkkDual::reachedExactObjectiveBound() {
  // Solving a minimization in dual simplex phase 2, and dual
  // objective exceeds the prescribed upper bound. However, costs
  // will be perturbed, so need to check whether exact dual
  // objective value exceeds the prescribed upper bound. This can be
  // a relatively expensive calculation, so determine whether to do
  // it according to the sparsity of the pivotal row
  bool reached_exact_objective_bound = false;
  double use_row_ap_density =
      std::min(std::max(ekk_instance_.info_.row_ap_density, 0.01), 1.0);
  HighsInt check_frequency = 1.0 / use_row_ap_density;
  assert(check_frequency > 0);

  bool check_exact_dual_objective_value =
      ekk_instance_.info_.update_count % check_frequency == 0;

  if (check_exact_dual_objective_value) {
    const double objective_bound = ekk_instance_.options_->objective_bound;
    const double perturbed_dual_objective_value =
        ekk_instance_.info_.updated_dual_objective_value;
    const double perturbed_value_residual =
        perturbed_dual_objective_value - objective_bound;
    HVector dual_col;
    HVector dual_row;
    const double exact_dual_objective_value =
        computeExactDualObjectiveValue(dual_col, dual_row);
    const double exact_value_residual =
        exact_dual_objective_value - objective_bound;
    std::string action;
    if (exact_dual_objective_value > objective_bound) {
      highsLogDev(
          ekk_instance_.options_->log_options, HighsLogType::kDetailed,
          "HEkkDual::solvePhase2: %12g = Objective > ObjectiveUB = %12g\n",
          ekk_instance_.info_.updated_dual_objective_value, objective_bound);
      action = "Have DualUB bailout";
      if (ekk_instance_.info_.costs_perturbed ||
          ekk_instance_.info_.costs_shifted) {
        // Remove cost perturbation/shifting
        ekk_instance_.initialiseCost(SimplexAlgorithm::kDual, kSolvePhase2);
      }

      // Set the duals as computed in the computeExactDualObjective call
      for (HighsInt i = 0; i < solver_num_col; i++)
        ekk_instance_.info_.workDual_[i] =
            ekk_instance_.info_.workCost_[i] - dual_row.array[i];
      for (HighsInt i = solver_num_col; i < solver_num_tot; i++)
        ekk_instance_.info_.workDual_[i] = -dual_col.array[i - solver_num_col];

      // Since the computeExactDualObjectiveValue() call succeeded, if there are
      // any dual infeasibilities they can be removed by a bound flip
      force_phase2 = false;
      correctDualInfeasibilities(dualInfeasCount);

      // no shifts should have occurred
      assert(!ekk_instance_.info_.costs_shifted);
      reached_exact_objective_bound = true;
      ekk_instance_.model_status_ = HighsModelStatus::kObjectiveBound;
    } else {
      action = "No   DualUB bailout";
    }
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
                "%s on iteration %" HIGHSINT_FORMAT
                ": Density %11.4g; Frequency %" HIGHSINT_FORMAT
                ": "
                "Residual(Perturbed = %g; Exact = %g)\n",
                action.c_str(), ekk_instance_.iteration_count_,
                use_row_ap_density, check_frequency, perturbed_value_residual,
                exact_value_residual);
  }
  return reached_exact_objective_bound;
}